

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

int __thiscall
Imf_3_2::DwaCompressor::compress
          (DwaCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  char cVar1;
  CompressorScheme CVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  size_t sVar8;
  void *pvVar9;
  int *piVar10;
  reference this_00;
  ulong uVar11;
  reference pvVar12;
  reference pvVar13;
  vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
  *this_01;
  reference pvVar14;
  reference ppcVar15;
  undefined8 uVar16;
  BaseExc *pBVar17;
  InputExc *this_02;
  undefined4 *in_RCX;
  void *__buf;
  long in_RSI;
  long in_RDI;
  vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
  *this_03;
  undefined8 *in_R8;
  reference rVar18;
  char *dst;
  uint64_t src;
  int i_2;
  size_t dstLen;
  size_t destLen;
  size_t sourceLen;
  size_t outSize;
  uint y_2;
  int scanlineSize;
  int byte;
  int x;
  char *row;
  uint y_1;
  LossyDctEncoder encoder_1;
  unsigned_short *nonlinearLut;
  ChannelData *cd_1;
  uint chan_2;
  LossyDctEncoderCsc encoder;
  uint csc;
  ChannelData *cd;
  uint chan_1;
  int y;
  uint chan;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  rowPtrs;
  vector<bool,_std::allocator<bool>_> encodedChannels;
  size_t i_1;
  char *writePtr;
  int maxY;
  int minY;
  int maxX;
  int minX;
  uint64_t *acCompression;
  uint64_t *totalDcUncompressedCount;
  uint64_t *totalAcUncompressedCount;
  uint64_t *rleRawSize;
  uint64_t *rleUncompressedSize;
  uint64_t *rleCompressedSize;
  uint64_t *dcCompressedSize;
  uint64_t *acCompressedSize;
  uint64_t *unknownCompressedSize;
  uint64_t *unknownUncompressedSize;
  uint64_t *version;
  char *outDataPtr;
  size_t i;
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
  channelRules;
  unsigned_short channelRuleSize;
  size_t outBufferSize;
  int fileVersion;
  char *packedDcEnd;
  char *packedAcEnd;
  char *inDataPtr;
  undefined1 *in_stack_fffffffffffff638;
  PixelType in_stack_fffffffffffff640;
  int in_stack_fffffffffffff644;
  undefined4 in_stack_fffffffffffff648;
  undefined4 in_stack_fffffffffffff64c;
  PixelType in_stack_fffffffffffff650;
  PixelType in_stack_fffffffffffff654;
  PixelType in_stack_fffffffffffff658;
  undefined4 in_stack_fffffffffffff65c;
  PixelType in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff664;
  undefined4 in_stack_fffffffffffff668;
  undefined4 in_stack_fffffffffffff66c;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffff670;
  float in_stack_fffffffffffff67c;
  LossyDctEncoderCsc *in_stack_fffffffffffff680;
  undefined8 uVar19;
  unsigned_short *in_stack_fffffffffffff690;
  char *pcVar20;
  undefined8 in_stack_fffffffffffff698;
  int in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a4;
  char *in_stack_fffffffffffff6a8;
  PixelType in_stack_fffffffffffff6b0;
  int in_stack_fffffffffffff6b4;
  unsigned_short *in_stack_fffffffffffff6b8;
  undefined8 in_stack_fffffffffffff6c0;
  long lVar21;
  char *in_stack_fffffffffffff6c8;
  Zip *in_stack_fffffffffffff6d0;
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
  *in_stack_fffffffffffff6f8;
  DwaCompressor *in_stack_fffffffffffff700;
  undefined4 in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7bc;
  DwaCompressor *in_stack_fffffffffffff7c0;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  *this_04;
  int local_73c;
  long local_738;
  long local_730;
  long local_728;
  long local_720;
  reference local_718;
  uint local_708;
  int local_704;
  int in_stack_fffffffffffff900;
  int in_stack_fffffffffffff904;
  char *local_6f8;
  uint local_6ec;
  LossyDctEncoderBase local_6e8;
  undefined1 *local_468;
  reference local_460;
  reference local_450;
  uint local_444;
  reference local_440;
  reference local_430;
  reference local_420 [8];
  DwaCompressor *in_stack_fffffffffffffc60;
  uint local_18c;
  uint local_180;
  int local_17c;
  reference local_178;
  uint local_168;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  local_160 [3];
  ulong local_118;
  long local_110;
  int local_108;
  int local_104;
  int local_100;
  undefined4 local_fc;
  ulong *local_f8;
  long *local_f0;
  long *local_e8;
  long *local_e0;
  long *local_d8;
  long *local_d0;
  long *local_c8;
  long *local_c0;
  long *local_b8;
  long *local_b0;
  long *local_a8;
  char *local_a0;
  ulong local_98;
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
  local_80;
  ushort local_62;
  ulong local_60;
  int local_54;
  long local_50;
  long local_48;
  long local_40;
  undefined8 *local_38;
  long local_20;
  
  local_48 = 0;
  local_50 = 0;
  local_54 = 2;
  local_38 = in_R8;
  local_20 = in_RSI;
  initializeDefaultChannelRules(in_stack_fffffffffffffc60);
  local_60 = 0;
  initializeBuffers(in_stack_fffffffffffff7c0,
                    (size_t *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  local_62 = 0;
  std::
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>::
  vector((vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
          *)0x1ca1d9);
  if (1 < local_54) {
    relevantChannelRules(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
    iVar5 = Xdr::size<unsigned_short>();
    local_62 = (ushort)iVar5;
    for (local_98 = 0; uVar11 = local_98,
        sVar7 = std::
                vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                ::size(&local_80), uVar11 < sVar7; local_98 = local_98 + 1) {
      std::
      vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
      ::operator[](&local_80,local_98);
      sVar8 = Classifier::size((Classifier *)
                               CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      local_62 = local_62 + (short)sVar8;
    }
  }
  local_60 = local_62 + local_60;
  if (*(ulong *)(in_RDI + 0xe0) < local_60) {
    *(ulong *)(in_RDI + 0xe0) = local_60;
    if ((*(long *)(in_RDI + 0xd8) != 0) && (*(void **)(in_RDI + 0xd8) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 0xd8));
    }
    pvVar9 = operator_new__(local_60);
    *(void **)(in_RDI + 0xd8) = pvVar9;
  }
  local_a0 = (char *)(*(long *)(in_RDI + 0xd8) + (ulong)local_62 + 0x58);
  if (*(long *)(in_RDI + 0xa8) != 0) {
    local_48 = *(long *)(in_RDI + 0xa8);
  }
  if (*(long *)(in_RDI + 0xb8) != 0) {
    local_50 = *(long *)(in_RDI + 0xb8);
  }
  local_a8 = *(long **)(in_RDI + 0xd8);
  local_b0 = (long *)(*(long *)(in_RDI + 0xd8) + 8);
  local_b8 = (long *)(*(long *)(in_RDI + 0xd8) + 0x10);
  local_c0 = (long *)(*(long *)(in_RDI + 0xd8) + 0x18);
  local_c8 = (long *)(*(long *)(in_RDI + 0xd8) + 0x20);
  local_d0 = (long *)(*(long *)(in_RDI + 0xd8) + 0x28);
  local_d8 = (long *)(*(long *)(in_RDI + 0xd8) + 0x30);
  local_e0 = (long *)(*(long *)(in_RDI + 0xd8) + 0x38);
  local_e8 = (long *)(*(long *)(in_RDI + 0xd8) + 0x40);
  local_f0 = (long *)(*(long *)(in_RDI + 0xd8) + 0x48);
  local_f8 = (ulong *)(*(long *)(in_RDI + 0xd8) + 0x50);
  local_fc = *in_RCX;
  piVar10 = std::min<int>(in_RCX + 2,(int *)(in_RDI + 0x24));
  local_100 = *piVar10;
  local_104 = in_RCX[1];
  piVar10 = std::min<int>(in_RCX + 3,(int *)(in_RDI + 0x28));
  local_108 = *piVar10;
  puVar3 = *(undefined8 **)(in_RDI + 0xd8);
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[10] = 0;
  *local_a8 = (long)local_54;
  *local_f8 = (ulong)*(uint *)(in_RDI + 0x10);
  setupChannelData((DwaCompressor *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                   (int)((ulong)in_stack_fffffffffffff698 >> 0x20),(int)in_stack_fffffffffffff698,
                   (int)((ulong)in_stack_fffffffffffff690 >> 0x20),(int)in_stack_fffffffffffff690);
  if (1 < local_54) {
    local_110 = *(long *)(in_RDI + 0xd8) + 0x58;
    Xdr::write<Imf_3_2::CharPtrIO,char*>
              ((char **)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
               (unsigned_short)((ulong)in_stack_fffffffffffff638 >> 0x30));
    for (local_118 = 0; uVar11 = local_118,
        sVar7 = std::
                vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                ::size(&local_80), uVar11 < sVar7; local_118 = local_118 + 1) {
      this_00 = std::
                vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                ::operator[](&local_80,local_118);
      Classifier::write(this_00,(int)&local_110,__buf,sVar7);
    }
  }
  std::
  vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
  ::size((vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
          *)(in_RDI + 0x60));
  std::allocator<bool>::allocator((allocator<bool> *)0x1ca692);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
             CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
             (allocator_type *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  std::allocator<bool>::~allocator((allocator<bool> *)0x1ca6be);
  std::
  vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
  ::size((vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
          *)(in_RDI + 0x60));
  std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>::allocator
            ((allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_> *)0x1ca6ec);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::vector((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
           CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
           (allocator_type *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
  std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>::~allocator
            ((allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_> *)0x1ca718);
  local_168 = 0;
  while( true ) {
    uVar11 = (ulong)local_168;
    sVar7 = std::
            vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
            ::size((vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                    *)(in_RDI + 0x60));
    if (sVar7 <= uVar11) break;
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                        CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    local_178 = rVar18;
    std::_Bit_reference::operator=(&local_178,false);
    local_168 = local_168 + 1;
  }
  local_40 = local_20;
  local_17c = local_104;
  while( true ) {
    if (local_108 < local_17c) break;
    local_180 = 0;
    while( true ) {
      sVar7 = std::
              vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
              ::size((vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                      *)(in_RDI + 0x60));
      if (sVar7 <= local_180) break;
      pvVar12 = std::
                vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                ::operator[]((vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                              *)(in_RDI + 0x60),(ulong)local_180);
      iVar5 = Imath_3_2::modp(in_stack_fffffffffffff644,in_stack_fffffffffffff640);
      if (iVar5 == 0) {
        std::
        vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ::operator[](local_160,(ulong)local_180);
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                   CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                   (value_type *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
        iVar5 = pvVar12->width;
        iVar6 = pixelTypeSize(in_stack_fffffffffffff654);
        local_40 = local_40 + iVar5 * iVar6;
      }
      local_180 = local_180 + 1;
    }
    local_17c = local_17c + 1;
  }
  local_40 = local_20;
  local_18c = 0;
  while( true ) {
    sVar7 = std::
            vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
            ::size((vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
                    *)(in_RDI + 0x78));
    if (sVar7 <= local_18c) break;
    this_03 = (vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
               *)(in_RDI + 0x78);
    pvVar13 = std::
              vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    this_04 = local_160;
    std::
    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
    ::operator[](this_04,(long)pvVar13->idx[0]);
    pvVar13 = std::
              vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    std::
    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
    ::operator[](this_04,(long)pvVar13->idx[1]);
    pvVar13 = std::
              vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    std::
    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
    ::operator[](this_04,(long)pvVar13->idx[2]);
    this_01 = (vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
               *)(in_RDI + 0x60);
    pvVar13 = std::
              vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    pvVar12 = std::
              vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
              ::operator[](this_01,(long)pvVar13->idx[0]);
    in_stack_fffffffffffff640 = pvVar12->width;
    pvVar13 = std::
              vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    std::
    vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
    ::operator[](this_01,(long)pvVar13->idx[0]);
    pvVar13 = std::
              vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    pvVar12 = std::
              vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
              ::operator[](this_01,(long)pvVar13->idx[0]);
    in_stack_fffffffffffff650 = pvVar12->type;
    pvVar13 = std::
              vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    pvVar12 = std::
              vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
              ::operator[](this_01,(long)pvVar13->idx[1]);
    in_stack_fffffffffffff658 = pvVar12->type;
    pvVar13 = std::
              vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    pvVar12 = std::
              vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
              ::operator[](this_01,(long)pvVar13->idx[2]);
    in_stack_fffffffffffff660 = pvVar12->type;
    in_stack_fffffffffffff638 = dwaCompressorToNonlinear;
    LossyDctEncoderCsc::LossyDctEncoderCsc
              (in_stack_fffffffffffff680,in_stack_fffffffffffff67c,in_stack_fffffffffffff670,
               (vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
               (char *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
               (char *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
               in_stack_fffffffffffff690,(int)in_stack_fffffffffffff698,in_stack_fffffffffffff6a0,
               (PixelType)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6b0,
               (PixelType)in_stack_fffffffffffff6b8);
    LossyDctEncoderBase::execute
              ((LossyDctEncoderBase *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900))
    ;
    iVar5 = LossyDctEncoderBase::numAcValuesEncoded((LossyDctEncoderBase *)(local_420 + 1));
    *local_e8 = *local_e8 + (long)iVar5;
    iVar5 = LossyDctEncoderBase::numDcValuesEncoded((LossyDctEncoderBase *)(local_420 + 1));
    *local_f0 = *local_f0 + (long)iVar5;
    iVar5 = LossyDctEncoderBase::numAcValuesEncoded((LossyDctEncoderBase *)(local_420 + 1));
    local_48 = local_48 + (long)iVar5 * 2;
    iVar5 = LossyDctEncoderBase::numDcValuesEncoded((LossyDctEncoderBase *)(local_420 + 1));
    local_50 = local_50 + (long)iVar5 * 2;
    std::
    vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
    ::operator[]((vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
                  *)(in_RDI + 0x78),(ulong)local_18c);
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                        CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    local_420[0] = rVar18;
    std::_Bit_reference::operator=(local_420,true);
    std::
    vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
    ::operator[]((vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
                  *)(in_RDI + 0x78),(ulong)local_18c);
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                        CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    local_430 = rVar18;
    std::_Bit_reference::operator=(&local_430,true);
    std::
    vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
    ::operator[]((vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
                  *)(in_RDI + 0x78),(ulong)local_18c);
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                        CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    local_440 = rVar18;
    std::_Bit_reference::operator=(&local_440,true);
    LossyDctEncoderCsc::~LossyDctEncoderCsc((LossyDctEncoderCsc *)0x1cae48);
    local_18c = local_18c + 1;
  }
  local_444 = 0;
  while( true ) {
    uVar11 = (ulong)local_444;
    sVar7 = std::
            vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
            ::size((vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                    *)(in_RDI + 0x60));
    iVar5 = (int)((ulong)in_stack_fffffffffffff6c0 >> 0x20);
    if (sVar7 <= uVar11) break;
    local_450 = std::
                vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                ::operator[]((vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                              *)(in_RDI + 0x60),(ulong)local_444);
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                        CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    local_460 = rVar18;
    bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_460);
    if (!bVar4) {
      CVar2 = local_450->compression;
      if (CVar2 == UNKNOWN) {
        iVar5 = local_450->width;
        local_704 = pixelTypeSize(in_stack_fffffffffffff654);
        local_704 = iVar5 * local_704;
        local_708 = 0;
        while( true ) {
          uVar11 = (ulong)local_708;
          pvVar14 = std::
                    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ::operator[](local_160,(ulong)local_444);
          sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(pvVar14);
          if (sVar7 <= uVar11) break;
          pcVar20 = local_450->planarUncBufferEnd;
          pvVar14 = std::
                    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ::operator[](local_160,(ulong)local_444);
          ppcVar15 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                               (pvVar14,(ulong)local_708);
          memcpy(pcVar20,*ppcVar15,(long)local_704);
          local_450->planarUncBufferEnd = local_450->planarUncBufferEnd + local_704;
          local_708 = local_708 + 1;
        }
        *local_b0 = (long)local_450->planarUncSize + *local_b0;
      }
      else if (CVar2 == LOSSY_DCT) {
        local_468 = (undefined1 *)0x0;
        if ((local_450->pLinear & 1U) == 0) {
          local_468 = dwaCompressorToNonlinear;
        }
        std::
        vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ::operator[](local_160,(ulong)local_444);
        in_stack_fffffffffffff640 = local_450->type;
        in_stack_fffffffffffff638 =
             (undefined1 *)
             CONCAT44((int)((ulong)in_stack_fffffffffffff638 >> 0x20),local_450->height);
        LossyDctEncoder::LossyDctEncoder
                  ((LossyDctEncoder *)in_stack_fffffffffffff680,in_stack_fffffffffffff67c,
                   in_stack_fffffffffffff670,
                   (char *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                   (char *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                   (unsigned_short *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                   in_stack_fffffffffffff654,(int)in_stack_fffffffffffff690,
                   (PixelType)in_stack_fffffffffffff698);
        LossyDctEncoderBase::execute
                  ((LossyDctEncoderBase *)
                   CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
        iVar5 = LossyDctEncoderBase::numAcValuesEncoded(&local_6e8);
        *local_e8 = *local_e8 + (long)iVar5;
        iVar5 = LossyDctEncoderBase::numDcValuesEncoded(&local_6e8);
        *local_f0 = *local_f0 + (long)iVar5;
        iVar5 = LossyDctEncoderBase::numAcValuesEncoded(&local_6e8);
        local_48 = local_48 + (long)iVar5 * 2;
        iVar5 = LossyDctEncoderBase::numDcValuesEncoded(&local_6e8);
        local_50 = (long)iVar5 * 2 + local_50;
        LossyDctEncoder::~LossyDctEncoder((LossyDctEncoder *)0x1cb11b);
      }
      else if (CVar2 == RLE) {
        local_6ec = 0;
        while( true ) {
          pvVar14 = std::
                    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ::operator[](local_160,(ulong)local_444);
          sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(pvVar14);
          if (sVar7 <= local_6ec) break;
          pvVar14 = std::
                    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ::operator[](local_160,(ulong)local_444);
          ppcVar15 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                               (pvVar14,(ulong)local_6ec);
          local_6f8 = *ppcVar15;
          for (in_stack_fffffffffffff904 = 0; in_stack_fffffffffffff904 < local_450->width;
              in_stack_fffffffffffff904 = in_stack_fffffffffffff904 + 1) {
            iVar5 = 0;
            while( true ) {
              in_stack_fffffffffffff900 = iVar5;
              iVar6 = pixelTypeSize(in_stack_fffffffffffff654);
              if (iVar6 <= iVar5) break;
              cVar1 = *local_6f8;
              pcVar20 = local_450->planarUncRleEnd[in_stack_fffffffffffff900];
              local_450->planarUncRleEnd[in_stack_fffffffffffff900] = pcVar20 + 1;
              *pcVar20 = cVar1;
              iVar5 = in_stack_fffffffffffff900 + 1;
              local_6f8 = local_6f8 + 1;
            }
          }
          iVar5 = local_450->width;
          iVar6 = pixelTypeSize(in_stack_fffffffffffff654);
          *local_e0 = (long)(iVar5 * iVar6) + *local_e0;
          local_6ec = local_6ec + 1;
        }
      }
      rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
                          CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
      local_718 = rVar18;
      std::_Bit_reference::operator=(&local_718,true);
    }
    local_444 = local_444 + 1;
  }
  if (*local_b0 != 0) {
    uVar19 = *(undefined8 *)(in_RDI + 0xe8);
    lVar21 = *local_b0;
    pcVar20 = local_a0;
    uVar16 = exr_compress_max_buffer_size();
    iVar6 = exr_compress_buffer(9,uVar19,lVar21,pcVar20,uVar16,&local_720);
    if (iVar6 != 0) {
      pBVar17 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::BaseExc::BaseExc(pBVar17,"Data compression (zlib) failed.");
      __cxa_throw(pBVar17,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
    }
    local_a0 = local_a0 + local_720;
    *local_b8 = local_720;
  }
  if (*local_e8 != 0) {
    if (*(int *)(in_RDI + 0x10) == 0) {
      iVar6 = hufCompress(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b4,
                          in_stack_fffffffffffff6a8);
      *local_c0 = (long)iVar6;
    }
    else if (*(int *)(in_RDI + 0x10) == 1) {
      lVar21 = *local_e8 * 2;
      in_stack_fffffffffffff6b8 = *(unsigned_short **)(in_RDI + 0xa8);
      in_stack_fffffffffffff6c8 = local_a0;
      local_728 = lVar21;
      in_stack_fffffffffffff6d0 = (Zip *)exr_compress_max_buffer_size();
      iVar6 = exr_compress_buffer(9,in_stack_fffffffffffff6b8,lVar21,in_stack_fffffffffffff6c8,
                                  in_stack_fffffffffffff6d0,&local_730);
      iVar5 = (int)((ulong)lVar21 >> 0x20);
      if (iVar6 != 0) {
        this_02 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::InputExc::InputExc(this_02,"Data compression (zlib) failed.");
        __cxa_throw(this_02,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
      }
      *local_c0 = local_730;
    }
    local_a0 = local_a0 + *local_c0;
  }
  if (*local_f0 != 0) {
    iVar5 = Zip::compress(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,iVar5,
                          (char *)in_stack_fffffffffffff6b8);
    *local_c8 = (long)iVar5;
    local_a0 = local_a0 + *local_c8;
  }
  if (*local_e0 != 0) {
    iVar5 = rleCompress((int)*local_e0,*(char **)(in_RDI + 0xf8),*(char **)(in_RDI + 200));
    *local_d8 = (long)iVar5;
    uVar19 = *(undefined8 *)(in_RDI + 200);
    lVar21 = *local_d8;
    pcVar20 = local_a0;
    uVar16 = exr_compress_max_buffer_size();
    iVar5 = exr_compress_buffer(9,uVar19,lVar21,pcVar20,uVar16,&local_738);
    if (iVar5 != 0) {
      pBVar17 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::BaseExc::BaseExc(pBVar17,"Error compressing RLE\'d data.");
      __cxa_throw(pBVar17,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
    }
    *local_d0 = local_738;
    local_a0 = local_a0 + *local_d0;
  }
  for (local_73c = 0; local_73c < 0xb; local_73c = local_73c + 1) {
    Xdr::write<Imf_3_2::CharPtrIO,char*>
              ((char **)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
               (uint64_t)in_stack_fffffffffffff638);
  }
  *local_38 = *(undefined8 *)(in_RDI + 0xd8);
  iVar5 = (int)local_a0 - (int)*(undefined8 *)(in_RDI + 0xd8);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x1cba10)
  ;
  std::
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>::
  ~vector((vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
           *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650));
  return iVar5;
}

Assistant:

int
DwaCompressor::compress (
    const char*            inPtr,
    int                    inSize,
    IMATH_NAMESPACE::Box2i range,
    const char*&           outPtr)
{
    const char* inDataPtr   = inPtr;
    char*       packedAcEnd = 0;
    char*       packedDcEnd = 0;
    int         fileVersion = 2; // Starting with 2, we write the channel
                                 // classification rules into the file

    if (fileVersion < 2)
        initializeLegacyChannelRules ();
    else
        initializeDefaultChannelRules ();

    size_t outBufferSize = 0;
    initializeBuffers (outBufferSize);

    unsigned short          channelRuleSize = 0;
    std::vector<Classifier> channelRules;
    if (fileVersion >= 2)
    {
        relevantChannelRules (channelRules);

        channelRuleSize = Xdr::size<unsigned short> ();
        for (size_t i = 0; i < channelRules.size (); ++i)
            channelRuleSize += channelRules[i].size ();
    }

    //
    // Remember to allocate _outBuffer, if we haven't done so already.
    //

    outBufferSize += channelRuleSize;
    if (outBufferSize > _outBufferSize)
    {
        _outBufferSize = outBufferSize;
        if (_outBuffer != 0) delete[] _outBuffer;
        _outBuffer = new char[outBufferSize];
    }

    char* outDataPtr =
        &_outBuffer[NUM_SIZES_SINGLE * sizeof (uint64_t) + channelRuleSize];

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and dereferencing
    // a vector will not be a good thing to do.
    //

    if (_packedAcBuffer) packedAcEnd = _packedAcBuffer;

    if (_packedDcBuffer) packedDcEnd = _packedDcBuffer;

#define OBIDX(x) (uint64_t*) &_outBuffer[x * sizeof (uint64_t)]

    uint64_t* version                 = OBIDX (VERSION);
    uint64_t* unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    uint64_t* unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    uint64_t* acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    uint64_t* dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    uint64_t* rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    uint64_t* rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    uint64_t* rleRawSize              = OBIDX (RLE_RAW_SIZE);

    uint64_t* totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    uint64_t* totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    uint64_t* acCompression = OBIDX (AC_COMPRESSION);

    int minX = range.min.x;
    int maxX = std::min (range.max.x, _max[0]);
    int minY = range.min.y;
    int maxY = std::min (range.max.y, _max[1]);

    //
    // Zero all the numbers in the chunk header
    //

    memset (_outBuffer, 0, NUM_SIZES_SINGLE * sizeof (uint64_t));

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;
    *acCompression = _acCompression;

    setupChannelData (minX, minY, maxX, maxY);

    if (fileVersion >= 2)
    {
        char* writePtr = &_outBuffer[NUM_SIZES_SINGLE * sizeof (uint64_t)];
        Xdr::write<CharPtrIO> (writePtr, channelRuleSize);

        for (size_t i = 0; i < channelRules.size (); ++i)
            channelRules[i].write (writePtr);
    }

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //

    std::vector<bool> encodedChannels (_channelData.size ());
    std::vector<std::vector<const char*>> rowPtrs (_channelData.size ());

    for (unsigned int chan = 0; chan < _channelData.size (); ++chan)
        encodedChannels[chan] = false;

    inDataPtr = inPtr;

    for (int y = minY; y <= maxY; ++y)
    {
        for (unsigned int chan = 0; chan < _channelData.size (); ++chan)
        {

            ChannelData* cd = &_channelData[chan];

            if (IMATH_NAMESPACE::modp (y, cd->ySampling) != 0) continue;

            rowPtrs[chan].push_back (inDataPtr);
            inDataPtr +=
                cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
        }
    }

    inDataPtr = inPtr;

    //
    // Make a pass over all our CSC sets and try to encode them first
    //

    for (unsigned int csc = 0; csc < _cscSets.size (); ++csc)
    {

        LossyDctEncoderCsc encoder (
            _dwaCompressionLevel / 100000.f,
            rowPtrs[_cscSets[csc].idx[0]],
            rowPtrs[_cscSets[csc].idx[1]],
            rowPtrs[_cscSets[csc].idx[2]],
            packedAcEnd,
            packedDcEnd,
            dwaCompressorToNonlinear,
            _channelData[_cscSets[csc].idx[0]].width,
            _channelData[_cscSets[csc].idx[0]].height,
            _channelData[_cscSets[csc].idx[0]].type,
            _channelData[_cscSets[csc].idx[1]].type,
            _channelData[_cscSets[csc].idx[2]].type);

        encoder.execute ();

        *totalAcUncompressedCount += encoder.numAcValuesEncoded ();
        *totalDcUncompressedCount += encoder.numDcValuesEncoded ();

        packedAcEnd += encoder.numAcValuesEncoded () * sizeof (unsigned short);
        packedDcEnd += encoder.numDcValuesEncoded () * sizeof (unsigned short);

        encodedChannels[_cscSets[csc].idx[0]] = true;
        encodedChannels[_cscSets[csc].idx[1]] = true;
        encodedChannels[_cscSets[csc].idx[2]] = true;
    }

    for (unsigned int chan = 0; chan < _channelData.size (); ++chan)
    {
        ChannelData* cd = &_channelData[chan];

        if (encodedChannels[chan]) continue;

        switch (cd->compression)
        {
            case LOSSY_DCT:

                //
                // For LOSSY_DCT, treat this just like the CSC'd case,
                // but only operate on one channel
                //

                {
                    const unsigned short* nonlinearLut = 0;

                    if (!cd->pLinear) nonlinearLut = dwaCompressorToNonlinear;

                    LossyDctEncoder encoder (
                        _dwaCompressionLevel / 100000.f,
                        rowPtrs[chan],
                        packedAcEnd,
                        packedDcEnd,
                        nonlinearLut,
                        cd->width,
                        cd->height,
                        cd->type);

                    encoder.execute ();

                    *totalAcUncompressedCount += encoder.numAcValuesEncoded ();
                    *totalDcUncompressedCount += encoder.numDcValuesEncoded ();

                    packedAcEnd +=
                        encoder.numAcValuesEncoded () * sizeof (unsigned short);

                    packedDcEnd +=
                        encoder.numDcValuesEncoded () * sizeof (unsigned short);
                }

                break;

            case RLE:

                //
                // For RLE, bash the bytes up so that the first bytes of each
                // pixel are contiguous, as are the second bytes, and so on.
                //

                for (unsigned int y = 0; y < rowPtrs[chan].size (); ++y)
                {
                    const char* row = rowPtrs[chan][y];

                    for (int x = 0; x < cd->width; ++x)
                    {
                        for (int byte = 0;
                             byte <
                             OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
                             ++byte)
                        {

                            *cd->planarUncRleEnd[byte]++ = *row++;
                        }
                    }

                    *rleRawSize +=
                        cd->width *
                        OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
                }

                break;

            case UNKNOWN:

                //
                // Otherwise, just copy data over verbatim
                //

                {
                    int scanlineSize =
                        cd->width *
                        OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);

                    for (unsigned int y = 0; y < rowPtrs[chan].size (); ++y)
                    {
                        memcpy (
                            cd->planarUncBufferEnd,
                            rowPtrs[chan][y],
                            scanlineSize);

                        cd->planarUncBufferEnd += scanlineSize;
                    }

                    *unknownUncompressedSize += cd->planarUncSize;
                }

                break;

            default: assert (false);
        }

        encodedChannels[chan] = true;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        size_t outSize;
        if (EXR_ERR_SUCCESS != exr_compress_buffer(
                9, // TODO: use default??? the old call to zlib had 9 hardcoded
                _planarUncBuffer[UNKNOWN],
                *unknownUncompressedSize,
                outDataPtr,
                exr_compress_max_buffer_size (*unknownUncompressedSize),
                &outSize))
        {
            throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
        }

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    {
        switch (_acCompression)
        {
            case STATIC_HUFFMAN:

                *acCompressedSize = (int) hufCompress (
                    (unsigned short*) _packedAcBuffer,
                    (int) *totalAcUncompressedCount,
                    outDataPtr);
                break;

            case DEFLATE:

            {
                size_t sourceLen = *totalAcUncompressedCount * sizeof (unsigned short);
                size_t destLen;
                if (EXR_ERR_SUCCESS != exr_compress_buffer(
                        9, // TODO: use default??? the old call to zlib had 9 hardcoded
                        _packedAcBuffer,
                        sourceLen,
                        outDataPtr,
                        exr_compress_max_buffer_size (sourceLen),
                        &destLen))
                {
                    throw IEX_NAMESPACE::InputExc (
                        "Data compression (zlib) failed.");
                }

                *acCompressedSize = destLen;
            }

            break;

            default: assert (false);
        }

        outDataPtr += *acCompressedSize;
    }

    //
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        *dcCompressedSize = _zip->compress (
            _packedDcBuffer,
            (int) (*totalDcUncompressedCount) * sizeof (unsigned short),
            outDataPtr);

        outDataPtr += *dcCompressedSize;
    }

    //
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //

    if (*rleRawSize > 0)
    {
        *rleUncompressedSize = rleCompress (
            (int) (*rleRawSize),
            _planarUncBuffer[RLE],
            (signed char*) _rleBuffer);

        size_t dstLen;
        if (EXR_ERR_SUCCESS != exr_compress_buffer(
                9, // TODO: use default??? the old call to zlib had 9 hardcoded
                _rleBuffer,
                *rleUncompressedSize,
                outDataPtr,
                exr_compress_max_buffer_size (*rleUncompressedSize),
                &dstLen))
        {
            throw IEX_NAMESPACE::BaseExc ("Error compressing RLE'd data.");
        }

        *rleCompressedSize = dstLen;
        outDataPtr += *rleCompressedSize;
    }

    //
    // Flip the counters to XDR format
    //

    for (int i = 0; i < NUM_SIZES_SINGLE; ++i)
    {
        uint64_t src = *(((uint64_t*) _outBuffer) + i);
        char*    dst = (char*) (((uint64_t*) _outBuffer) + i);

        Xdr::write<CharPtrIO> (dst, src);
    }

    //
    // We're done - compute the number of bytes we packed
    //

    outPtr = _outBuffer;

    return static_cast<int> (outDataPtr - _outBuffer);
}